

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContextCore.cpp
# Opt level: O0

ScriptContext * __thiscall JsrtContextCore::EnsureScriptContext(JsrtContextCore *this)

{
  code *pcVar1;
  bool bVar2;
  JavascriptLibrary *pJVar3;
  undefined4 *puVar4;
  JsrtRuntime *this_00;
  ScriptContext *pSVar5;
  HeapAllocator *alloc;
  ChakraCoreHostScriptContext *this_01;
  Recycler *this_02;
  GlobalObject *obj;
  JavascriptFunction *pJVar6;
  JavascriptLibrary *library;
  TrackAllocData local_58;
  BasePtr<Js::ScriptContext> local_20;
  AutoPtr<Js::ScriptContext,_Memory::HeapAllocator> newScriptContext;
  ThreadContext *localThreadContext;
  JsrtContextCore *this_local;
  
  pJVar3 = JsrtContext::GetJavascriptLibrary(&this->super_JsrtContext);
  if (pJVar3 != (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtContextCore.cpp"
                       ,0x49,"(this->GetJavascriptLibrary() == nullptr)",
                       "this->GetJavascriptLibrary() == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = JsrtContext::GetRuntime(&this->super_JsrtContext);
  newScriptContext.super_BasePtr<Js::ScriptContext>.ptr =
       (BasePtr<Js::ScriptContext>)JsrtRuntime::GetThreadContext(this_00);
  pSVar5 = Js::ScriptContext::New
                     ((ThreadContext *)newScriptContext.super_BasePtr<Js::ScriptContext>.ptr);
  AutoPtr<Js::ScriptContext,_Memory::HeapAllocator>::AutoPtr
            ((AutoPtr<Js::ScriptContext,_Memory::HeapAllocator> *)&local_20,pSVar5);
  pSVar5 = BasePtr<Js::ScriptContext>::operator->(&local_20);
  Js::ScriptContext::Initialize(pSVar5);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&ChakraCoreHostScriptContext::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtContextCore.cpp"
             ,0x51);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_58);
  this_01 = (ChakraCoreHostScriptContext *)new<Memory::HeapAllocator>(0x38,alloc,0x350bd0);
  pSVar5 = BasePtr::operator_cast_to_ScriptContext_((BasePtr *)&local_20);
  ChakraCoreHostScriptContext::ChakraCoreHostScriptContext(this_01,pSVar5);
  this->hostContext = this_01;
  pSVar5 = BasePtr<Js::ScriptContext>::operator->(&local_20);
  Js::ScriptContext::SetHostScriptContext(pSVar5,&this->hostContext->super_HostScriptContext);
  pSVar5 = BasePtr<Js::ScriptContext>::Detach(&local_20);
  pJVar3 = Js::ScriptContext::GetLibrary(pSVar5);
  JsrtContext::SetJavascriptLibrary(&this->super_JsrtContext,pJVar3);
  pSVar5 = JsrtContext::GetScriptContext(&this->super_JsrtContext);
  pJVar3 = Js::ScriptContext::GetLibrary(pSVar5);
  if (pJVar3 == (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtContextCore.cpp"
                       ,0x57,"(library != nullptr)","library != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_02 = ThreadContext::GetRecycler
                      ((ThreadContext *)newScriptContext.super_BasePtr<Js::ScriptContext>.ptr);
  obj = Js::JavascriptLibrary::GetGlobalObject(pJVar3);
  Memory::Recycler::RootRelease(this_02,obj,(uint *)0x0);
  pJVar6 = Js::JavascriptLibrary::GetEvalFunctionObject(pJVar3);
  Js::JavascriptFunction::SetEntryPoint(pJVar6,Js::GlobalObject::EntryEval);
  pJVar6 = Js::JavascriptLibraryBase::GetFunctionConstructor(&pJVar3->super_JavascriptLibraryBase);
  Js::JavascriptFunction::SetEntryPoint(pJVar6,Js::JavascriptFunction::NewInstance);
  pSVar5 = JsrtContext::GetScriptContext(&this->super_JsrtContext);
  AutoPtr<Js::ScriptContext,_Memory::HeapAllocator>::~AutoPtr
            ((AutoPtr<Js::ScriptContext,_Memory::HeapAllocator> *)&local_20);
  return pSVar5;
}

Assistant:

Js::ScriptContext* JsrtContextCore::EnsureScriptContext()
{
    Assert(this->GetJavascriptLibrary() == nullptr);

    ThreadContext* localThreadContext = this->GetRuntime()->GetThreadContext();

    AutoPtr<Js::ScriptContext> newScriptContext(Js::ScriptContext::New(localThreadContext));

    newScriptContext->Initialize();

    hostContext = HeapNew(ChakraCoreHostScriptContext, newScriptContext);
    newScriptContext->SetHostScriptContext(hostContext);

    this->SetJavascriptLibrary(newScriptContext.Detach()->GetLibrary());

    Js::JavascriptLibrary *library = this->GetScriptContext()->GetLibrary();
    Assert(library != nullptr);
    localThreadContext->GetRecycler()->RootRelease(library->GetGlobalObject());

    library->GetEvalFunctionObject()->SetEntryPoint(&Js::GlobalObject::EntryEval);
    library->GetFunctionConstructor()->SetEntryPoint(&Js::JavascriptFunction::NewInstance);

    return this->GetScriptContext();
}